

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall
fmt::internal::PrintfArgFormatter<char>::visit_cstring(PrintfArgFormatter<char> *this,char *value)

{
  size_t in_RCX;
  void *in_RDX;
  StringValue<char> SStack_18;
  
  if (value != (char *)0x0) {
    if (((this->super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>).spec_)->
        type_ == 'p') {
      BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>::write_pointer
                (&this->super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>,value
                );
      return;
    }
    SStack_18.value = value;
    if (value == (char *)0x0) {
      SStack_18.size = 0;
    }
    else {
      SStack_18.size = strlen(value);
    }
    BasicWriter<char>::write_str<char>
              ((this->super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>).
               writer_,&SStack_18,
               (this->super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>).spec_)
    ;
    return;
  }
  if (((this->super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>).spec_)->type_
      != 'p') {
    BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>::write
              (&this->super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>,
               0x20bf38,in_RDX,in_RCX);
    return;
  }
  ((this->super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>).spec_)->type_ =
       '\0';
  BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>::write
            (&this->super_BasicArgFormatter<fmt::internal::PrintfArgFormatter<char>,_char>,0x20bf3f,
             in_RDX,in_RCX);
  return;
}

Assistant:

void visit_cstring(const char *value) {
    if (value)
      Base::visit_cstring(value);
    else if (this->spec().type_ == 'p')
      write_null_pointer();
    else
      this->write("(null)");
  }